

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Instruction *i,bool sparse,
          bool *forward,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  ushort uVar1;
  ID id;
  string *expr;
  SPIRType *out_type;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  ulong uVar8;
  SPIRCombinedImageSampler *pSVar9;
  CompilerError *this_00;
  undefined7 in_register_00000009;
  undefined4 uVar10;
  uint32_t uVar11;
  int iVar12;
  uint32_t uVar13;
  SmallVector<unsigned_int,_8UL> *ts_3;
  uint32_t length;
  uint local_190;
  undefined4 local_18c;
  undefined4 local_188;
  uint32_t dref;
  uint32_t *opt;
  uint32_t *local_178;
  undefined4 local_170;
  uint32_t coffset;
  uint32_t grad_y;
  uint32_t grad_x;
  uint32_t lod;
  uint32_t local_15c;
  uint32_t flags;
  uint32_t minlod;
  uint32_t sample;
  uint32_t coffsets;
  uint32_t offset;
  uint32_t bias;
  SPIRType *local_140;
  ulong local_138;
  uint local_130;
  uint32_t local_12c;
  undefined4 local_128;
  uint32_t coord;
  string *local_120;
  string local_118;
  uint32_t local_f8;
  uint32_t uStack_f4;
  uint32_t uStack_f0;
  uint32_t uStack_ec;
  uint32_t local_e8;
  uint32_t uStack_e4;
  uint32_t uStack_e0;
  uint32_t uStack_dc;
  uint32_t local_d8;
  uint32_t uStack_d4;
  ulong uStack_d0;
  string local_c8;
  bool *local_a8;
  SPIRType *local_a0;
  string local_98;
  uint32_t local_78 [2];
  SPIRType *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  anon_class_32_4_6bb8ed97 test;
  
  local_170 = (undefined4)CONCAT71(in_register_00000009,sparse);
  ts_3 = inherited_expressions;
  local_a8 = forward;
  local_178 = Compiler::stream(&this->super_Compiler,i);
  uVar1 = i->op;
  length = i->length;
  id.id = local_178[2];
  coord = local_178[3];
  dref = 0;
  opt = (uint32_t *)0x0;
  local_a0 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,*local_178);
  SmallVector<unsigned_int,_8UL>::push_back(inherited_expressions,&coord);
  bVar2 = Compiler::has_decoration(&this->super_Compiler,id,DecorationNonUniform);
  local_15c = id.id;
  if (bVar2) {
    pSVar6 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id.id);
    uVar10 = (undefined4)CONCAT71((int7)((ulong)&coord >> 8),pSVar6 == (SPIRVariable *)0x0);
  }
  else {
    uVar10 = 0;
  }
  switch(uVar1) {
  case 0x59:
  case 0x5a:
switchD_002e54dd_caseD_133:
    dref = local_178[4];
    opt = local_178 + 5;
    length = length - 5;
    break;
  case 0x5b:
  case 0x5c:
switchD_002e54dd_caseD_135:
    opt = local_178 + 4;
    length = length - 4;
    goto LAB_002e5550;
  case 0x5d:
  case 0x5e:
switchD_002e54dd_caseD_137:
    dref = local_178[4];
    opt = local_178 + 5;
    length = length - 5;
LAB_002e5550:
    local_18c = 0;
    local_190 = (uint)CONCAT71((int7)((ulong)opt >> 8),1);
    goto LAB_002e5581;
  case 0x5f:
  case 0x62:
switchD_002e54dd_caseD_139:
    opt = local_178 + 4;
    length = length - 4;
    local_190 = 0;
    local_18c = (undefined4)CONCAT71((int7)((ulong)opt >> 8),1);
    goto LAB_002e5581;
  case 0x60:
switchD_002e54dd_caseD_13a:
    uVar11 = local_178[4];
    length = length - 5;
    opt = local_178 + 5;
    bVar2 = (this->options).es;
    uVar5 = (this->options).version;
    if ((uVar5 < 0x136 & bVar2) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather requires ESSL 310.");
LAB_002e5cdb:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_18c = 0;
    local_188 = (undefined4)CONCAT71((int7)((ulong)opt >> 8),1);
    if (bVar2 == false && uVar5 < 400) {
      bVar2 = expression_is_constant_null(this,uVar11);
      if (!bVar2) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"textureGather with component requires GLSL 400.");
        goto LAB_002e5cdb;
      }
      ::std::__cxx11::string::string
                ((string *)&local_118,"GL_ARB_texture_gather",(allocator *)local_78);
      require_extension_internal(this,&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
    }
    local_18c = 0;
    local_190 = 0;
    goto LAB_002e558b;
  case 0x61:
switchD_002e54dd_caseD_13b:
    dref = local_178[4];
    length = length - 5;
    opt = local_178 + 5;
    bVar2 = (this->options).es;
    uVar5 = (this->options).version;
    if ((uVar5 < 0x136 & bVar2) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather requires ESSL 310.");
      goto LAB_002e5cdb;
    }
    if (bVar2 == false && uVar5 < 400) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureGather with depth compare requires GLSL 400.");
      goto LAB_002e5cdb;
    }
    local_18c = 0;
    local_188 = (undefined4)CONCAT71((int7)((ulong)opt >> 8),1);
    local_190 = 0;
    goto LAB_002e5589;
  default:
    switch(uVar1) {
    case 0x133:
    case 0x134:
      goto switchD_002e54dd_caseD_133;
    case 0x135:
    case 0x136:
      goto switchD_002e54dd_caseD_135;
    case 0x137:
    case 0x138:
      goto switchD_002e54dd_caseD_137;
    case 0x139:
      goto switchD_002e54dd_caseD_139;
    case 0x13a:
      goto switchD_002e54dd_caseD_13a;
    case 0x13b:
      goto switchD_002e54dd_caseD_13b;
    default:
      opt = local_178 + 4;
      length = length - 4;
    }
  }
  local_18c = 0;
  local_190 = 0;
LAB_002e5581:
  local_188 = 0;
LAB_002e5589:
  uVar11 = 0;
LAB_002e558b:
  local_12c = uVar11;
  local_128 = uVar10;
  pSVar7 = Compiler::expression_type(&this->super_Compiler,local_15c);
  local_140 = Compiler::get<spirv_cross::SPIRType>
                        (&this->super_Compiler,(pSVar7->super_IVariant).self.id);
  uVar8 = (ulong)(local_140->image).dim;
  if (uVar8 < 6) {
    iVar12 = *(int *)(&DAT_003a0740 + uVar8 * 4);
  }
  else {
    iVar12 = 2;
  }
  if (dref != 0) {
    SmallVector<unsigned_int,_8UL>::push_back(inherited_expressions,&dref);
  }
  local_130 = (uint)(local_140->image).arrayed;
  bias = 0;
  lod = 0;
  grad_x = 0;
  grad_y = 0;
  coffset = 0;
  offset = 0;
  coffsets = 0;
  sample = 0;
  minlod = 0;
  flags = 0;
  if (length != 0) {
    flags = *opt;
    length = length - 1;
    opt = opt + 1;
  }
  test.length = &length;
  test.flags = &flags;
  test.opt = &opt;
  local_138 = (ulong)uVar1;
  local_120 = __return_storage_ptr__;
  test.inherited_expressions = inherited_expressions;
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&bias,1);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&lod,2);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&grad_x,4);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&grad_y,4);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&coffset,8);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&offset,0x10);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&coffsets,0x20);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&sample,0x40);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()(&test,&minlod,0x80);
  expr = local_120;
  pSVar7 = local_140;
  uVar11 = local_15c;
  (local_120->_M_dataplus)._M_p = (pointer)&local_120->field_2;
  local_120->_M_string_length = 0;
  local_78[0] = local_15c;
  local_78[1] = 0;
  local_70 = local_140;
  local_68 = (ulong)CONCAT12((char)local_190,CONCAT11((char)local_188,(char)local_18c));
  uStack_60 = (ulong)CONCAT15(minlod != 0,
                              CONCAT14((char)local_170,
                                       CONCAT13(dref != 0,
                                                CONCAT12(grad_y != 0 || grad_x != 0,
                                                         CONCAT11(offset != 0 || coffset != 0,
                                                                  coffsets != 0)))));
  (local_120->field_2)._M_local_buf[0] = '\0';
  local_58 = (ulong)lod;
  (*(this->super_Compiler)._vptr_Compiler[0x1e])(&local_118,this);
  ::std::__cxx11::string::append((string *)expr);
  out_type = local_a0;
  ::std::__cxx11::string::~string((string *)&local_118);
  ::std::__cxx11::string::append((char *)expr);
  uVar4 = 0;
  if ((char)local_170 != '\0') {
    uVar4 = get_sparse_feedback_texel_id(this,local_178[1]);
  }
  local_118._M_dataplus._M_p._0_4_ = uVar11;
  local_118._M_dataplus._M_p._4_4_ = 0;
  local_118._M_string_length = (size_type)pSVar7;
  local_118.field_2._M_local_buf[1] = (char)local_188;
  local_118.field_2._M_local_buf[0] = (char)local_18c;
  local_118.field_2._M_local_buf[2] = (undefined1)local_190;
  local_118.field_2._M_allocated_capacity._3_5_ = 0;
  local_118.field_2._12_4_ = iVar12 + (local_190 & 0xff) + local_130;
  local_118.field_2._8_4_ = coord;
  _local_f8 = CONCAT44(grad_x,dref);
  _uStack_f0 = CONCAT44(lod,grad_y);
  uVar13 = coffset;
  if (coffset == 0) {
    uVar13 = offset;
  }
  if (coffsets != 0) {
    uVar13 = coffsets;
  }
  _local_e8 = CONCAT44(bias,uVar13);
  _uStack_e0 = CONCAT44(sample,local_12c);
  _local_d8 = CONCAT44(minlod,uVar4);
  uStack_d0 = (ulong)CONCAT11(coffsets != 0,(char)local_128);
  (*(this->super_Compiler)._vptr_Compiler[0x1f])(&local_c8,this,&local_118,local_a8);
  ::std::__cxx11::string::append((string *)expr);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::append((char *)expr);
  bVar2 = is_legacy(this);
  if (((bVar2) && ((this->options).es == false)) &&
     (bVar2 = Compiler::is_depth_image(&this->super_Compiler,pSVar7,uVar11), bVar2)) {
    ::std::__cxx11::string::append((char *)expr);
  }
  if ((this->backend).comparison_image_samples_scalar != true) goto LAB_002e5a6d;
  uVar5 = (int)local_138 - 0x57;
  if (((0xb < uVar5) || ((0x933U >> (uVar5 & 0x1f) & 1) == 0)) &&
     ((uVar5 = (int)local_138 - 0x131, 0xf < uVar5 || ((0x8133U >> (uVar5 & 0x1f) & 1) == 0))))
  goto LAB_002e5a6d;
  pSVar9 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>(&this->super_Compiler,uVar11);
  uVar4 = uVar11;
  if (pSVar9 == (SPIRCombinedImageSampler *)0x0) {
LAB_002e59f0:
    bVar3 = Compiler::is_depth_image(&this->super_Compiler,local_140,uVar11);
  }
  else {
    uVar4 = (pSVar9->image).id;
    bVar2 = Compiler::is_depth_image(&this->super_Compiler,local_140,uVar4);
    bVar3 = true;
    if (!bVar2) goto LAB_002e59f0;
  }
  pSVar6 = Compiler::maybe_get_backing_variable(&this->super_Compiler,uVar4);
  if (pSVar6 == (SPIRVariable *)0x0) {
    if (bVar3 == false) goto LAB_002e5a6d;
  }
  else {
    pSVar7 = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
    bVar2 = Compiler::is_depth_image(&this->super_Compiler,pSVar7,(pSVar6->super_IVariant).self.id);
    if (!bVar2 && bVar3 == false) goto LAB_002e5a6d;
  }
  remap_swizzle(&local_c8,this,out_type,1,expr);
  ::std::__cxx11::string::operator=((string *)expr,(string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_c8);
LAB_002e5a6d:
  if ((((char)local_170 == '\0') && ((this->backend).support_small_type_sampling_result == false))
     && (out_type->width < 0x20)) {
    type_to_glsl_constructor_abi_cxx11_(&local_98,this,out_type);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_c8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
               (char (*) [2])ts_3);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  if ((int)local_138 == 0x62) {
    remap_swizzle(&local_c8,this,out_type,4,expr);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  return expr;
}

Assistant:

std::string CompilerGLSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                        SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);
	uint32_t length = i.length;

	uint32_t result_type_id = ops[0];
	VariableID img = ops[2];
	uint32_t coord = ops[3];
	uint32_t dref = 0;
	uint32_t comp = 0;
	bool gather = false;
	bool proj = false;
	bool fetch = false;
	bool nonuniform_expression = false;
	const uint32_t *opt = nullptr;

	auto &result_type = get<SPIRType>(result_type_id);

	inherited_expressions.push_back(coord);
	if (has_decoration(img, DecorationNonUniform) && !maybe_get_backing_variable(img))
		nonuniform_expression = true;

	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		break;

	case OpImageSampleProjDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		proj = true;
		break;

	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("textureGather with depth compare requires GLSL 400.");
		break;

	case OpImageGather:
	case OpImageSparseGather:
		comp = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
		{
			if (!expression_is_constant_null(comp))
				SPIRV_CROSS_THROW("textureGather with component requires GLSL 400.");
			require_extension_internal("GL_ARB_texture_gather");
		}
		break;

	case OpImageFetch:
	case OpImageSparseFetch:
	case OpImageRead: // Reads == fetches in Metal (other langs will not get here)
		opt = &ops[4];
		length -= 4;
		fetch = true;
		break;

	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
		opt = &ops[4];
		length -= 4;
		proj = true;
		break;

	default:
		opt = &ops[4];
		length -= 4;
		break;
	}

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	uint32_t coord_components = 0;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		coord_components = 1;
		break;
	case spv::Dim2D:
		coord_components = 2;
		break;
	case spv::Dim3D:
		coord_components = 3;
		break;
	case spv::DimCube:
		coord_components = 3;
		break;
	case spv::DimBuffer:
		coord_components = 1;
		break;
	default:
		coord_components = 2;
		break;
	}

	if (dref)
		inherited_expressions.push_back(dref);

	if (proj)
		coord_components++;
	if (imgtype.image.arrayed)
		coord_components++;

	uint32_t bias = 0;
	uint32_t lod = 0;
	uint32_t grad_x = 0;
	uint32_t grad_y = 0;
	uint32_t coffset = 0;
	uint32_t offset = 0;
	uint32_t coffsets = 0;
	uint32_t sample = 0;
	uint32_t minlod = 0;
	uint32_t flags = 0;

	if (length)
	{
		flags = *opt++;
		length--;
	}

	auto test = [&](uint32_t &v, uint32_t flag) {
		if (length && (flags & flag))
		{
			v = *opt++;
			inherited_expressions.push_back(v);
			length--;
		}
	};

	test(bias, ImageOperandsBiasMask);
	test(lod, ImageOperandsLodMask);
	test(grad_x, ImageOperandsGradMask);
	test(grad_y, ImageOperandsGradMask);
	test(coffset, ImageOperandsConstOffsetMask);
	test(offset, ImageOperandsOffsetMask);
	test(coffsets, ImageOperandsConstOffsetsMask);
	test(sample, ImageOperandsSampleMask);
	test(minlod, ImageOperandsMinLodMask);

	TextureFunctionBaseArguments base_args = {};
	base_args.img = img;
	base_args.imgtype = &imgtype;
	base_args.is_fetch = fetch != 0;
	base_args.is_gather = gather != 0;
	base_args.is_proj = proj != 0;

	string expr;
	TextureFunctionNameArguments name_args = {};

	name_args.base = base_args;
	name_args.has_array_offsets = coffsets != 0;
	name_args.has_offset = coffset != 0 || offset != 0;
	name_args.has_grad = grad_x != 0 || grad_y != 0;
	name_args.has_dref = dref != 0;
	name_args.is_sparse_feedback = sparse;
	name_args.has_min_lod = minlod != 0;
	name_args.lod = lod;
	expr += to_function_name(name_args);
	expr += "(";

	uint32_t sparse_texel_id = 0;
	if (sparse)
		sparse_texel_id = get_sparse_feedback_texel_id(ops[1]);

	TextureFunctionArguments args = {};
	args.base = base_args;
	args.coord = coord;
	args.coord_components = coord_components;
	args.dref = dref;
	args.grad_x = grad_x;
	args.grad_y = grad_y;
	args.lod = lod;
	args.has_array_offsets = coffsets != 0;

	if (coffsets)
		args.offset = coffsets;
	else if (coffset)
		args.offset = coffset;
	else
		args.offset = offset;

	args.bias = bias;
	args.component = comp;
	args.sample = sample;
	args.sparse_texel = sparse_texel_id;
	args.min_lod = minlod;
	args.nonuniform_expression = nonuniform_expression;
	expr += to_function_args(args, forward);
	expr += ")";

	// texture(samplerXShadow) returns float. shadowX() returns vec4, but only in desktop GLSL. Swizzle here.
	if (is_legacy() && !options.es && is_depth_image(imgtype, img))
		expr += ".r";

	// Sampling from a texture which was deduced to be a depth image, might actually return 1 component here.
	// Remap back to 4 components as sampling opcodes expect.
	if (backend.comparison_image_samples_scalar && image_opcode_is_sample_no_dref(op))
	{
		bool image_is_depth = false;
		const auto *combined = maybe_get<SPIRCombinedImageSampler>(img);
		VariableID image_id = combined ? combined->image : img;

		if (combined && is_depth_image(imgtype, combined->image))
			image_is_depth = true;
		else if (is_depth_image(imgtype, img))
			image_is_depth = true;

		// We must also check the backing variable for the image.
		// We might have loaded an OpImage, and used that handle for two different purposes.
		// Once with comparison, once without.
		auto *image_variable = maybe_get_backing_variable(image_id);
		if (image_variable && is_depth_image(get<SPIRType>(image_variable->basetype), image_variable->self))
			image_is_depth = true;

		if (image_is_depth)
			expr = remap_swizzle(result_type, 1, expr);
	}

	if (!sparse && !backend.support_small_type_sampling_result && result_type.width < 32)
	{
		// Just value cast (narrowing) to expected type since we cannot rely on narrowing to work automatically.
		// Hopefully compiler picks this up and converts the texturing instruction to the appropriate precision.
		expr = join(type_to_glsl_constructor(result_type), "(", expr, ")");
	}

	// Deals with reads from MSL. We might need to downconvert to fewer components.
	if (op == OpImageRead)
		expr = remap_swizzle(result_type, 4, expr);

	return expr;
}